

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGhsMultiGenerator.cxx
# Opt level: O1

void __thiscall
cmGlobalGhsMultiGenerator::cmGlobalGhsMultiGenerator(cmGlobalGhsMultiGenerator *this,cmake *cm)

{
  cmGlobalGenerator::cmGlobalGenerator(&this->super_cmGlobalGenerator,cm);
  (this->super_cmGlobalGenerator)._vptr_cmGlobalGenerator =
       (_func_int **)&PTR__cmGlobalGhsMultiGenerator_009648f0;
  (this->StampFile)._M_dataplus._M_p = (pointer)&(this->StampFile).field_2;
  (this->StampFile)._M_string_length = 0;
  (this->StampFile).field_2._M_local_buf[0] = '\0';
  (this->ProjectTargets).
  super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ProjectTargets).
  super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ProjectTargets).
  super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmState::SetGhsMultiIDE
            ((cm->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
             super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
             super__Head_base<0UL,_cmState_*,_false>._M_head_impl,true);
  return;
}

Assistant:

cmGlobalGhsMultiGenerator::cmGlobalGhsMultiGenerator(cmake* cm)
  : cmGlobalGenerator(cm)
{
  cm->GetState()->SetGhsMultiIDE(true);
}